

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4s.c
# Opt level: O1

int roslz4_decompress(roslz4_stream *str)

{
  void *pvVar1;
  int iVar2;
  
  pvVar1 = str->state;
  if (*(int *)((long)pvVar1 + 0x20) == 0) {
    iVar2 = processHeader(str);
    if (0 < iVar2) {
      do {
        if (str->input_left < 1) {
          return 0;
        }
        iVar2 = readBlockSize(str);
        if (iVar2 == 0) {
          return 0;
        }
        if (*(int *)((long)pvVar1 + 0x40) == 0) {
          iVar2 = readChecksum(str);
          return iVar2;
        }
        iVar2 = readBlock(str);
        if (iVar2 == 0) {
          return 0;
        }
        if (iVar2 < 0) goto LAB_0012d1ce;
        iVar2 = decompressBlock(str);
      } while (-1 < iVar2);
    }
  }
  else {
LAB_0012d1ce:
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int roslz4_decompress(roslz4_stream *str) {
  stream_state *state = str->state;
  if (state->finished) {
    return ROSLZ4_ERROR; // Already reached end of stream
  }

  // Return if header isn't present or error was encountered
  int ret = processHeader(str);
  if (ret <= 0) {
    return ret;
  }

  // Read in blocks and decompress them as long as there's data to be processed
  while (str->input_left > 0) {
    ret = readBlockSize(str);
    if (ret == 0) { return ROSLZ4_OK; }

    if (state->block_size == kEndOfStream) {
      return readChecksum(str);
    }

    ret = readBlock(str);
    if (ret == 0) { return ROSLZ4_OK; }
    else if (ret < 0) { return ret; }

    ret = decompressBlock(str);
    if (ret < 0) { return ret; }
  }
  return ROSLZ4_OK;
}